

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lt.c
# Opt level: O0

void lt_generate_mat(m256v *M,parameters *P,int n_ISIs,uint32_t *ISIs)

{
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  int j_1;
  int j;
  tuple T;
  int i;
  undefined4 local_44;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  int in_stack_ffffffffffffffc4;
  uint8_t val;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar2;
  
  m256v_clear((m256v *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    tuple_generate_from_ISI
              ((uint32_t)((ulong)in_RCX >> 0x20),
               (parameters *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (uint8_t)((uint)in_stack_ffffffffffffffc4 >> 0x18));
    for (iVar1 = 1; val = (uint8_t)((uint)in_stack_ffffffffffffffc4 >> 0x18),
        iVar1 < in_stack_ffffffffffffffc4; iVar1 = iVar1 + 1) {
      in_stack_ffffffffffffffcc =
           (in_stack_ffffffffffffffcc + in_stack_ffffffffffffffc8) % *(int *)(in_RSI + 0x1c);
      m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,val);
    }
    for (; *(int *)(in_RSI + 0x20) <= in_stack_ffffffffffffffd8;
        in_stack_ffffffffffffffd8 =
             (in_stack_ffffffffffffffd8 + in_stack_ffffffffffffffd4) % *(int *)(in_RSI + 0x24)) {
    }
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,val);
    for (local_44 = 1; local_44 < in_stack_ffffffffffffffd0; local_44 = local_44 + 1) {
      for (in_stack_ffffffffffffffd8 =
                (in_stack_ffffffffffffffd8 + in_stack_ffffffffffffffd4) % *(int *)(in_RSI + 0x24);
          *(int *)(in_RSI + 0x20) <= in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffd8 =
               (in_stack_ffffffffffffffd8 + in_stack_ffffffffffffffd4) % *(int *)(in_RSI + 0x24)) {
      }
      m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (uint8_t)((uint)in_stack_ffffffffffffffc4 >> 0x18));
    }
  }
  return;
}

Assistant:

void lt_generate_mat(m256v* M,
			const parameters* P,
			int n_ISIs,
			const uint32_t* ISIs)
{
	assert(M->n_row == n_ISIs);
	assert(M->n_col == P->L);

	m256v_clear(M);
	for (int i = 0; i < n_ISIs; ++i) {
		tuple T = tuple_generate_from_ISI(ISIs[i], P);
		m256v_set_el(M, i, T.b, 1);
		for (int j = 1; j < T.d; ++j) {
			T.b = (T.b + T.a) % P->W;
			m256v_set_el(M, i, T.b, 1);
		}
		while (T.b1 >= P->P)
			T.b1 = (T.b1 + T.a1) % P->P1;
		m256v_set_el(M, i, P->W + T.b1, 1);
		for (int j = 1; j < T.d1; ++j) {
			T.b1 = (T.b1 + T.a1) % P->P1;
			while (T.b1 >= P->P)
				T.b1 = (T.b1 + T.a1) % P->P1;
			m256v_set_el(M, i, P->W + T.b1, 1);
		}
	}
}